

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O2

REF_STATUS ref_matrix_intersect(REF_DBL *m1,REF_DBL *m2,REF_DBL *m12)

{
  REF_INT i;
  uint uVar1;
  long lVar2;
  REF_DBL *m;
  double dVar3;
  REF_DBL m1neghalf [6];
  REF_DBL m2bar [6];
  REF_DBL m1half [6];
  REF_DBL m12bar [6];
  REF_DBL aRStack_148 [6];
  REF_DBL local_118 [6];
  REF_DBL local_e8 [6];
  undefined1 local_b8 [16];
  double local_a8;
  REF_DBL local_58 [7];
  
  m = aRStack_148;
  uVar1 = ref_matrix_sqrt_m(m1,local_e8,aRStack_148);
  if (uVar1 == 0) {
    ref_matrix_mult_m0m1m0(aRStack_148,m2,local_118);
    uVar1 = ref_matrix_diag_m(local_118,(REF_DBL *)local_b8);
    if (uVar1 == 0) {
      local_b8 = maxpd(_DAT_0012a2a0,local_b8);
      dVar3 = 1.0;
      if (1.0 <= local_a8) {
        dVar3 = local_a8;
      }
      local_a8 = dVar3;
      ref_matrix_form_m((REF_DBL *)local_b8,local_58);
      ref_matrix_mult_m0m1m0(local_e8,local_58,m12);
      return 0;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x2c6,
           "ref_matrix_intersect",(ulong)uVar1,"diag m12bar");
    puts("m1");
    ref_matrix_show_m(m1);
    puts("m2");
    ref_matrix_show_m(m2);
    puts("m2bar");
    ref_matrix_show_m(local_118);
    puts("m1neghalf");
  }
  else {
    if (uVar1 == 4) {
      for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
        m12[lVar2] = m2[lVar2];
      }
      return 0;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x2b5,
           "ref_matrix_intersect","ref_matrix_sqrt_m failed");
    puts("m1");
    ref_matrix_show_m(m1);
    puts("m2");
    m = m2;
  }
  ref_matrix_show_m(m);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_intersect(REF_DBL *m1, REF_DBL *m2,
                                        REF_DBL *m12) {
  REF_DBL m1half[6];
  REF_DBL m1neghalf[6];
  REF_DBL m2bar[6];
  REF_DBL m12bar[6];
  REF_DBL m12bar_system[12];
  REF_STATUS sqrt_m1_status;
  sqrt_m1_status = ref_matrix_sqrt_m(m1, m1half, m1neghalf);
  if (REF_DIV_ZERO == sqrt_m1_status) {
    REF_INT i;
    for (i = 0; i < 6; i++) m12[i] = m2[i];
    return REF_SUCCESS;
  }
  if (REF_SUCCESS != sqrt_m1_status) {
    REF_WHERE("ref_matrix_sqrt_m failed");
    printf("m1\n");
    ref_matrix_show_m(m1);
    printf("m2\n");
    ref_matrix_show_m(m2);
    return sqrt_m1_status;
  }
  RSS(ref_matrix_mult_m0m1m0(m1neghalf, m2, m2bar), "m2bar=m1half*m2*m1half");
  RSB(ref_matrix_diag_m(m2bar, m12bar_system), "diag m12bar", {
    printf("m1\n");
    ref_matrix_show_m(m1);
    printf("m2\n");
    ref_matrix_show_m(m2);
    printf("m2bar\n");
    ref_matrix_show_m(m2bar);
    printf("m1neghalf\n");
    ref_matrix_show_m(m1neghalf);
  });
  ref_matrix_eig(m12bar_system, 0) = MAX(1.0, ref_matrix_eig(m12bar_system, 0));
  ref_matrix_eig(m12bar_system, 1) = MAX(1.0, ref_matrix_eig(m12bar_system, 1));
  ref_matrix_eig(m12bar_system, 2) = MAX(1.0, ref_matrix_eig(m12bar_system, 2));

  RSS(ref_matrix_form_m(m12bar_system, m12bar), "form m12bar");

  RSS(ref_matrix_mult_m0m1m0(m1half, m12bar, m12), "m12=m1half*m12bar*m1half");

  return REF_SUCCESS;
}